

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlReconciliateNs(xmlDocPtr doc,xmlNodePtr tree)

{
  xmlNsPtr pxVar1;
  int local_58;
  int i;
  int ret;
  xmlAttrPtr attr;
  xmlNodePtr node;
  xmlNsPtr n;
  int nbCache;
  int sizeCache;
  xmlNsPtr *newNs;
  xmlNsPtr *oldNs;
  xmlNodePtr tree_local;
  xmlDocPtr doc_local;
  
  newNs = (xmlNsPtr *)0x0;
  _nbCache = (void *)0x0;
  n._4_4_ = 0;
  n._0_4_ = 0;
  if ((tree == (xmlNodePtr)0x0) || (tree->type != XML_ELEMENT_NODE)) {
    doc_local._4_4_ = -1;
  }
  else if ((doc == (xmlDocPtr)0x0) || (doc->type != XML_DOCUMENT_NODE)) {
    doc_local._4_4_ = -1;
  }
  else {
    attr = (xmlAttrPtr)tree;
    if (tree->doc == doc) {
      while (attr != (xmlAttrPtr)0x0) {
        if (attr->ns != (xmlNs *)0x0) {
          if (n._4_4_ == 0) {
            n._4_4_ = 10;
            newNs = (xmlNsPtr *)(*xmlMalloc)(0x50);
            if (newNs == (xmlNsPtr *)0x0) {
              xmlTreeErrMemory("fixing namespaces");
              return -1;
            }
            _nbCache = (*xmlMalloc)(0x50);
            if (_nbCache == (void *)0x0) {
              xmlTreeErrMemory("fixing namespaces");
              (*xmlFree)(newNs);
              return -1;
            }
          }
          for (local_58 = 0; local_58 < (int)n; local_58 = local_58 + 1) {
            if (newNs[local_58] == attr->ns) {
              attr->ns = *(xmlNs **)((long)_nbCache + (long)local_58 * 8);
              break;
            }
          }
          if ((local_58 == (int)n) &&
             (pxVar1 = xmlNewReconciledNs(doc,tree,attr->ns), pxVar1 != (xmlNsPtr)0x0)) {
            if (n._4_4_ <= (int)n) {
              n._4_4_ = n._4_4_ << 1;
              newNs = (xmlNsPtr *)(*xmlRealloc)(newNs,(long)n._4_4_ << 3);
              if (newNs == (xmlNsPtr *)0x0) {
                xmlTreeErrMemory("fixing namespaces");
                (*xmlFree)(_nbCache);
                return -1;
              }
              _nbCache = (*xmlRealloc)(_nbCache,(long)n._4_4_ << 3);
              if (_nbCache == (void *)0x0) {
                xmlTreeErrMemory("fixing namespaces");
                (*xmlFree)(newNs);
                return -1;
              }
            }
            *(xmlNsPtr *)((long)_nbCache + (long)(int)n * 8) = pxVar1;
            newNs[(int)n] = attr->ns;
            attr->ns = pxVar1;
            n._0_4_ = (int)n + 1;
          }
        }
        if (attr->type == XML_ELEMENT_NODE) {
          for (_i = attr->psvi; _i != (void *)0x0; _i = *(void **)((long)_i + 0x30)) {
            if (*(long *)((long)_i + 0x48) != 0) {
              if (n._4_4_ == 0) {
                n._4_4_ = 10;
                newNs = (xmlNsPtr *)(*xmlMalloc)(0x50);
                if (newNs == (xmlNsPtr *)0x0) {
                  xmlTreeErrMemory("fixing namespaces");
                  return -1;
                }
                _nbCache = (*xmlMalloc)(0x50);
                if (_nbCache == (void *)0x0) {
                  xmlTreeErrMemory("fixing namespaces");
                  (*xmlFree)(newNs);
                  return -1;
                }
              }
              for (local_58 = 0; local_58 < (int)n; local_58 = local_58 + 1) {
                if (newNs[local_58] == *(xmlNsPtr *)((long)_i + 0x48)) {
                  *(undefined8 *)((long)_i + 0x48) =
                       *(undefined8 *)((long)_nbCache + (long)local_58 * 8);
                  break;
                }
              }
              if ((local_58 == (int)n) &&
                 (pxVar1 = xmlNewReconciledNs(doc,tree,*(xmlNsPtr *)((long)_i + 0x48)),
                 pxVar1 != (xmlNsPtr)0x0)) {
                if (n._4_4_ <= (int)n) {
                  n._4_4_ = n._4_4_ << 1;
                  newNs = (xmlNsPtr *)(*xmlRealloc)(newNs,(long)n._4_4_ << 3);
                  if (newNs == (xmlNsPtr *)0x0) {
                    xmlTreeErrMemory("fixing namespaces");
                    (*xmlFree)(_nbCache);
                    return -1;
                  }
                  _nbCache = (*xmlRealloc)(_nbCache,(long)n._4_4_ << 3);
                  if (_nbCache == (void *)0x0) {
                    xmlTreeErrMemory("fixing namespaces");
                    (*xmlFree)(newNs);
                    return -1;
                  }
                }
                *(xmlNsPtr *)((long)_nbCache + (long)(int)n * 8) = pxVar1;
                newNs[(int)n] = *(xmlNsPtr *)((long)_i + 0x48);
                *(xmlNsPtr *)((long)_i + 0x48) = pxVar1;
                n._0_4_ = (int)n + 1;
              }
            }
          }
        }
        if ((attr->children == (_xmlNode *)0x0) || (attr->type == XML_ENTITY_REF_NODE)) {
          if (((xmlNodePtr)attr == tree) || (attr->next == (_xmlAttr *)0x0)) {
            if ((xmlNodePtr)attr == tree) break;
            do {
              if ((xmlNodePtr)attr == tree) goto LAB_001c189a;
              if (attr->parent != (_xmlNode *)0x0) {
                attr = (xmlAttrPtr)attr->parent;
              }
              if (((xmlNodePtr)attr != tree) && (attr->next != (_xmlAttr *)0x0)) {
                attr = attr->next;
                goto LAB_001c189a;
              }
            } while (attr->parent != (_xmlNode *)0x0);
            attr = (xmlAttrPtr)0x0;
LAB_001c189a:
            if ((xmlNodePtr)attr == tree) {
              attr = (xmlAttrPtr)0x0;
            }
          }
          else {
            attr = attr->next;
          }
        }
        else {
          attr = (xmlAttrPtr)attr->children;
        }
      }
      if (newNs != (xmlNsPtr *)0x0) {
        (*xmlFree)(newNs);
      }
      if (_nbCache != (void *)0x0) {
        (*xmlFree)(_nbCache);
      }
      doc_local._4_4_ = 0;
    }
    else {
      doc_local._4_4_ = -1;
    }
  }
  return doc_local._4_4_;
}

Assistant:

int
xmlReconciliateNs(xmlDocPtr doc, xmlNodePtr tree) {
    xmlNsPtr *oldNs = NULL;
    xmlNsPtr *newNs = NULL;
    int sizeCache = 0;
    int nbCache = 0;

    xmlNsPtr n;
    xmlNodePtr node = tree;
    xmlAttrPtr attr;
    int ret = 0, i;

    if ((node == NULL) || (node->type != XML_ELEMENT_NODE)) return(-1);
    if ((doc == NULL) || (doc->type != XML_DOCUMENT_NODE)) return(-1);
    if (node->doc != doc) return(-1);
    while (node != NULL) {
        /*
	 * Reconciliate the node namespace
	 */
	if (node->ns != NULL) {
	    /*
	     * initialize the cache if needed
	     */
	    if (sizeCache == 0) {
		sizeCache = 10;
		oldNs = (xmlNsPtr *) xmlMalloc(sizeCache *
					       sizeof(xmlNsPtr));
		if (oldNs == NULL) {
		    xmlTreeErrMemory("fixing namespaces");
		    return(-1);
		}
		newNs = (xmlNsPtr *) xmlMalloc(sizeCache *
					       sizeof(xmlNsPtr));
		if (newNs == NULL) {
		    xmlTreeErrMemory("fixing namespaces");
		    xmlFree(oldNs);
		    return(-1);
		}
	    }
	    for (i = 0;i < nbCache;i++) {
	        if (oldNs[i] == node->ns) {
		    node->ns = newNs[i];
		    break;
		}
	    }
	    if (i == nbCache) {
	        /*
		 * OK we need to recreate a new namespace definition
		 */
		n = xmlNewReconciledNs(doc, tree, node->ns);
		if (n != NULL) { /* :-( what if else ??? */
		    /*
		     * check if we need to grow the cache buffers.
		     */
		    if (sizeCache <= nbCache) {
		        sizeCache *= 2;
			oldNs = (xmlNsPtr *) xmlRealloc(oldNs, sizeCache *
			                               sizeof(xmlNsPtr));
		        if (oldNs == NULL) {
			    xmlTreeErrMemory("fixing namespaces");
			    xmlFree(newNs);
			    return(-1);
			}
			newNs = (xmlNsPtr *) xmlRealloc(newNs, sizeCache *
			                               sizeof(xmlNsPtr));
		        if (newNs == NULL) {
			    xmlTreeErrMemory("fixing namespaces");
			    xmlFree(oldNs);
			    return(-1);
			}
		    }
		    newNs[nbCache] = n;
		    oldNs[nbCache++] = node->ns;
		    node->ns = n;
                }
	    }
	}
	/*
	 * now check for namespace held by attributes on the node.
	 */
	if (node->type == XML_ELEMENT_NODE) {
	    attr = node->properties;
	    while (attr != NULL) {
		if (attr->ns != NULL) {
		    /*
		     * initialize the cache if needed
		     */
		    if (sizeCache == 0) {
			sizeCache = 10;
			oldNs = (xmlNsPtr *) xmlMalloc(sizeCache *
						       sizeof(xmlNsPtr));
			if (oldNs == NULL) {
			    xmlTreeErrMemory("fixing namespaces");
			    return(-1);
			}
			newNs = (xmlNsPtr *) xmlMalloc(sizeCache *
						       sizeof(xmlNsPtr));
			if (newNs == NULL) {
			    xmlTreeErrMemory("fixing namespaces");
			    xmlFree(oldNs);
			    return(-1);
			}
		    }
		    for (i = 0;i < nbCache;i++) {
			if (oldNs[i] == attr->ns) {
			    attr->ns = newNs[i];
			    break;
			}
		    }
		    if (i == nbCache) {
			/*
			 * OK we need to recreate a new namespace definition
			 */
			n = xmlNewReconciledNs(doc, tree, attr->ns);
			if (n != NULL) { /* :-( what if else ??? */
			    /*
			     * check if we need to grow the cache buffers.
			     */
			    if (sizeCache <= nbCache) {
				sizeCache *= 2;
				oldNs = (xmlNsPtr *) xmlRealloc(oldNs,
				           sizeCache * sizeof(xmlNsPtr));
				if (oldNs == NULL) {
				    xmlTreeErrMemory("fixing namespaces");
				    xmlFree(newNs);
				    return(-1);
				}
				newNs = (xmlNsPtr *) xmlRealloc(newNs,
				           sizeCache * sizeof(xmlNsPtr));
				if (newNs == NULL) {
				    xmlTreeErrMemory("fixing namespaces");
				    xmlFree(oldNs);
				    return(-1);
				}
			    }
			    newNs[nbCache] = n;
			    oldNs[nbCache++] = attr->ns;
			    attr->ns = n;
			}
		    }
		}
		attr = attr->next;
	    }
	}

	/*
	 * Browse the full subtree, deep first
	 */
        if ((node->children != NULL) && (node->type != XML_ENTITY_REF_NODE)) {
	    /* deep first */
	    node = node->children;
	} else if ((node != tree) && (node->next != NULL)) {
	    /* then siblings */
	    node = node->next;
	} else if (node != tree) {
	    /* go up to parents->next if needed */
	    while (node != tree) {
	        if (node->parent != NULL)
		    node = node->parent;
		if ((node != tree) && (node->next != NULL)) {
		    node = node->next;
		    break;
		}
		if (node->parent == NULL) {
		    node = NULL;
		    break;
		}
	    }
	    /* exit condition */
	    if (node == tree)
	        node = NULL;
	} else
	    break;
    }
    if (oldNs != NULL)
	xmlFree(oldNs);
    if (newNs != NULL)
	xmlFree(newNs);
    return(ret);
}